

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O1

void __thiscall
NetworkNS::dump::add_snapshot_to_dump
          (dump *this,NetwMin *netw_app,cb3D_integrator *b3D,uint timestep)

{
  uint uVar1;
  ofstream *this_00;
  ostream *poVar2;
  _List_node_base *p_Var3;
  
  this_00 = &this->my_file;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"ITEM: TIMESTEP\n",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"ITEM: NUMBER OF ATOMS\n",0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"ITEM: BOX BOUNDS pp pp pp\n",0x1a);
  poVar2 = std::ostream::_M_insert<double>(netw_app->domain->BoxLow[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>(netw_app->domain->BoxHigh[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  poVar2 = std::ostream::_M_insert<double>(netw_app->domain->BoxLow[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>(netw_app->domain->BoxHigh[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  poVar2 = std::ostream::_M_insert<double>(netw_app->domain->BoxLow[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>(netw_app->domain->BoxHigh[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"ITEM: ATOMS id x y z ix iy iz Vor VorNeigh xx yy zz xy xz yz\n",
             0x3d);
  *(undefined8 *)(&this->field_0x10 + *(long *)(*(long *)&this->my_file + -0x18)) = 6;
  p_Var3 = (netw_app->network->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&netw_app->network->nodes) {
    do {
      uVar1 = *(int *)&p_Var3[1]._M_next - 1;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)this_00,*(int *)&p_Var3[1]._M_next);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>(b3D->bd_x[uVar1 * 3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>(b3D->bd_x[uVar1 * 3 + 1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>(b3D->bd_x[uVar1 * 3 + 2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," 0 0 0 1.0 0 ",0xd);
      poVar2 = std::ostream::_M_insert<double>(*b3D->bd_stress[uVar1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>(b3D->bd_stress[uVar1][1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>(b3D->bd_stress[uVar1][2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>(b3D->bd_stress[uVar1][3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>(b3D->bd_stress[uVar1][4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>(b3D->bd_stress[uVar1][5]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&netw_app->network->nodes);
  }
  return;
}

Assistant:

void dump::add_snapshot_to_dump(const class NetwMin *netw_app, const class cb3D_integrator *b3D, 
                                   unsigned int timestep){
      
      my_file << "ITEM: TIMESTEP\n";
      my_file << timestep << "\n";
      my_file << "ITEM: NUMBER OF ATOMS\n";
      my_file << netw_app->network->nodes.size() << "\n";
      my_file << "ITEM: BOX BOUNDS pp pp pp\n";
      my_file << netw_app->domain->BoxLow[0] << " " << netw_app->domain->BoxHigh[0] << "\n";
      my_file << netw_app->domain->BoxLow[1] << " " << netw_app->domain->BoxHigh[1] << "\n";
      my_file << netw_app->domain->BoxLow[2] << " " << netw_app->domain->BoxHigh[2] << "\n";
      my_file << "ITEM: ATOMS id x y z ix iy iz Vor VorNeigh xx yy zz xy xz yz\n";
      
      // TODO: Here we can ask for a Voronoi tessellation of the simulation box in order to 
      //       calculate atomic volumes.
      
      my_file.precision(6);
      for (std::list <tNode>::iterator it = netw_app->network->nodes.begin();
           it != netw_app->network->nodes.end(); ++it){
         
         unsigned int ibead = (*it).Id - 1;
         
         my_file << (*it).Id << " " 
                 << b3D->bd_x[3*ibead + 0] << " "
                 << b3D->bd_x[3*ibead + 1] << " "
                 << b3D->bd_x[3*ibead + 2] << " "
                 << " 0 0 0 1.0 0 " 
                 << b3D->bd_stress[ibead][0] << " "
                 << b3D->bd_stress[ibead][1] << " "
                 << b3D->bd_stress[ibead][2] << " "
                 << b3D->bd_stress[ibead][3] << " "
                 << b3D->bd_stress[ibead][4] << " "
                 << b3D->bd_stress[ibead][5] << endl;
      }
   }